

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.cpp
# Opt level: O0

void __thiscall Js::DynamicObject::ChangeType(DynamicObject *this)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  ScriptContext *this_00;
  ThreadContext *threadContext;
  DynamicType *this_01;
  DynamicTypeHandler *this_02;
  undefined4 *puVar4;
  undefined4 extraout_var;
  undefined1 local_20 [8];
  AutoDisableInterrupt autoDisableInterrupt;
  DynamicObject *this_local;
  
  autoDisableInterrupt._8_8_ = this;
  this_00 = RecyclableObject::GetScriptContext(&this->super_RecyclableObject);
  threadContext = ScriptContext::GetThreadContext(this_00);
  AutoDisableInterrupt::AutoDisableInterrupt((AutoDisableInterrupt *)local_20,threadContext,true);
  this_01 = GetDynamicType(this);
  bVar2 = DynamicType::GetIsShared(this_01);
  if (bVar2) {
    this_02 = GetTypeHandler(this);
    bVar2 = DynamicTypeHandler::GetIsShared(this_02);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicObject.cpp"
                                  ,0x26a,
                                  "(!GetDynamicType()->GetIsShared() || GetTypeHandler()->GetIsShared())"
                                  ,
                                  "!GetDynamicType()->GetIsShared() || GetTypeHandler()->GetIsShared()"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
  }
  iVar3 = (*(this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x67])();
  Memory::WriteBarrierPtr<Js::Type>::operator=
            (&(this->super_RecyclableObject).type,(Type *)CONCAT44(extraout_var,iVar3));
  AutoDisableInterrupt::Completed((AutoDisableInterrupt *)local_20);
  AutoDisableInterrupt::~AutoDisableInterrupt((AutoDisableInterrupt *)local_20);
  return;
}

Assistant:

void DynamicObject::ChangeType()
    {
        // Allocation won't throw any more, otherwise we should use AutoDisableInterrupt to guard here
        AutoDisableInterrupt autoDisableInterrupt(this->GetScriptContext()->GetThreadContext());

        Assert(!GetDynamicType()->GetIsShared() || GetTypeHandler()->GetIsShared());
        this->type = this->DuplicateType();
        autoDisableInterrupt.Completed();
    }